

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O2

void irr::executeBlit_TextureBlend_16_to_16(SBlitJob *job)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  short sVar6;
  void *pvVar7;
  u32 dy;
  uint uVar8;
  int iVar9;
  u32 dx;
  ulong uVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  
  fVar12 = floorf((float)job->x_stretch * 262144.0 + 0.0);
  fVar13 = floorf((float)job->y_stretch * 262144.0 + 0.0);
  pvVar7 = job->dst;
  uVar2 = job->height;
  iVar9 = 0;
  for (uVar8 = 0; uVar8 < uVar2; uVar8 = uVar8 + 1) {
    iVar3 = job->srcPitch;
    pvVar5 = job->src;
    uVar4 = job->width;
    iVar11 = 0;
    for (uVar10 = 0; uVar10 < uVar4; uVar10 = uVar10 + 1) {
      uVar1 = *(ushort *)
               ((long)pvVar5 + (long)(iVar11 >> 0x12) * 2 + (long)(iVar9 >> 0x12) * (long)iVar3);
      sVar6 = (short)uVar1 >> 0xf;
      *(ushort *)((long)pvVar7 + uVar10 * 2) =
           sVar6 + 0x8000U & uVar1 | 0x7fffU - sVar6 & *(ushort *)((long)pvVar7 + uVar10 * 2);
      iVar11 = iVar11 + (int)fVar12;
    }
    pvVar7 = (void *)((long)pvVar7 + (ulong)job->dstPitch);
    iVar9 = iVar9 + (int)fVar13;
  }
  return;
}

Assistant:

static void executeBlit_TextureBlend_16_to_16(const SBlitJob *job)
{
	const f18 wscale = f32_to_f18(job->x_stretch);
	const f18 hscale = f32_to_f18(job->y_stretch);

	f18 src_y = f18_zero;
	u16 *dst = (u16 *)job->dst;

	for (u32 dy = 0; dy < job->height; ++dy, src_y += hscale) {
		const u16 *src = (u16 *)((u8 *)(job->src) + job->srcPitch * f18_floor(src_y));
		f18 src_x = f18_zero;
		for (u32 dx = 0; dx < job->width; ++dx, src_x += wscale) {
			dst[dx] = PixelBlend16(dst[dx], src[f18_floor(src_x)]);
		}
		dst = (u16 *)((u8 *)(dst) + job->dstPitch);
	}
}